

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udbgutil.cpp
# Opt level: O0

int32_t stringToStringBuffer(char *target,int32_t targetCapacity,char *str,UErrorCode *status)

{
  UBool UVar1;
  int32_t iVar2;
  size_t sVar3;
  char *__s;
  char *s;
  int32_t len;
  UErrorCode *status_local;
  char *str_local;
  int32_t targetCapacity_local;
  char *target_local;
  
  status_local = (UErrorCode *)str;
  if (str == (char *)0x0) {
    status_local = (UErrorCode *)nullString;
  }
  sVar3 = strlen((char *)status_local);
  s._4_4_ = (int32_t)sVar3;
  UVar1 = U_SUCCESS(*status);
  if (UVar1 == '\0') {
    __s = u_errorName_63(*status);
    sVar3 = strlen(__s);
    s._4_4_ = (int32_t)sVar3;
    if (target != (char *)0x0) {
      iVar2 = uprv_min_63(s._4_4_,targetCapacity);
      strncpy(target,__s,(long)iVar2);
    }
  }
  else if (target != (char *)0x0) {
    iVar2 = uprv_min_63(s._4_4_,targetCapacity);
    strncpy(target,(char *)status_local,(long)iVar2);
  }
  iVar2 = u_terminateChars_63(target,targetCapacity,s._4_4_,status);
  return iVar2;
}

Assistant:

static int32_t stringToStringBuffer(char *target, int32_t targetCapacity, const char *str, UErrorCode *status) {
  if(str==NULL) str=nullString;

  int32_t len = static_cast<int32_t>(uprv_strlen(str));
  if (U_SUCCESS(*status)) {
    if(target!=NULL) {
      uprv_strncpy(target,str,uprv_min(len,targetCapacity));
    }
  } else {
    const char *s = u_errorName(*status);
    len = static_cast<int32_t>(uprv_strlen(s));
    if(target!=NULL) {
      uprv_strncpy(target,s,uprv_min(len,targetCapacity));
    }
  }
  return u_terminateChars(target, targetCapacity, len, status);
}